

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O1

void __thiscall
TC_parser<true>::parserWarning
          (TC_parser<true> *this,char *message,char *begin,char *pos,char *message2)

{
  char *pcVar1;
  size_t sVar2;
  ostream *poVar3;
  char *local_70 [2];
  char local_60 [16];
  char *local_50 [2];
  char local_40 [16];
  
  if (message == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2dba28);
  }
  else {
    sVar2 = strlen(message);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,message,sVar2);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,begin,pos);
  pcVar1 = local_50[0];
  if (local_50[0] == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2dba28);
  }
  else {
    sVar2 = strlen(local_50[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar2);
  }
  if (message2 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2dba28);
  }
  else {
    sVar2 = strlen(message2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,message2,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"in Example #",0xc);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,": \"",3);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>((string *)local_70,this->beginLine,this->endLine);
  pcVar1 = local_70[0];
  if (local_70[0] == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)poVar3->_vptr_basic_ostream[-3]);
  }
  else {
    sVar2 = strlen(local_70[0]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return;
}

Assistant:

inline void parserWarning(const char* message, char* begin, char* pos, const char* message2)
  {
    cerr << message << std::string(begin, pos - begin).c_str() << message2 << "in Example #"
         << this->p->end_parsed_examples << ": \"" << std::string(this->beginLine, this->endLine).c_str() << "\""
         << endl;
  }